

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O0

GENERAL_NAMES *
v2i_GENERAL_NAMES(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  CONF_VALUE *pCVar1;
  GENERAL_NAME *a;
  size_t sVar2;
  GENERAL_NAME *gen;
  CONF_VALUE *cnf;
  size_t i;
  GENERAL_NAMES *gens;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)sk_GENERAL_NAME_new_null();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    for (cnf = (CONF_VALUE *)0x0;
        pCVar1 = (CONF_VALUE *)sk_CONF_VALUE_num((stack_st_CONF_VALUE *)nval), cnf < pCVar1;
        cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
      pCVar1 = sk_CONF_VALUE_value((stack_st_CONF_VALUE *)nval,(size_t)cnf);
      a = v2i_GENERAL_NAME(method,ctx,(CONF_VALUE *)pCVar1);
      if ((a == (GENERAL_NAME *)0x0) ||
         (sVar2 = sk_GENERAL_NAME_push((stack_st_GENERAL_NAME *)method_local,(GENERAL_NAME *)a),
         sVar2 == 0)) {
        GENERAL_NAME_free(a);
        sk_GENERAL_NAME_pop_free((stack_st_GENERAL_NAME *)method_local,GENERAL_NAME_free);
        return (GENERAL_NAMES *)0x0;
      }
    }
  }
  return (GENERAL_NAMES *)method_local;
}

Assistant:

GENERAL_NAMES *v2i_GENERAL_NAMES(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
    if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
      GENERAL_NAME_free(gen);
      goto err;
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}